

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double chi_cdf(double x,double a,double b,double c)

{
  double dVar1;
  
  if (a < x) {
    dVar1 = (x - a) / b;
    dVar1 = r8_gamma_inc(c * 0.5,dVar1 * 0.5 * dVar1);
    return dVar1;
  }
  return 0.0;
}

Assistant:

double chi_cdf ( double x, double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    CHI_CDF evaluates the Chi CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double A, B, C, the parameters of the PDF.
//    0 < B,
//    0 < C.
//
//    Output, double CDF, the value of the CDF.
//
{
  double cdf;
  double p2;
  double x2;
  double y;

  if ( x <= a )
  {
    cdf = 0.0;
  }
  else
  {
    y = ( x - a ) / b;
    x2 = 0.5 * y * y;
    p2 = 0.5 * c;

    cdf = r8_gamma_inc ( p2, x2 );
  }

  return cdf;
}